

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<pstore::gsl::span<unsigned_char,_1l>const&>>,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>const&>>
               (tuple<testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                *matcher_tuple,
               tuple<int,_const_pstore::gsl::span<unsigned_char,__1L>_&> *value_tuple)

{
  bool bVar1;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001bb478;
  bVar1 = MatcherBase<int>::MatchAndExplain
                    ((MatcherBase<int> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                      ).super__Head_base<0UL,_testing::Matcher<int>,_false>,
                     &(value_tuple->
                      super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
                      super__Head_base<0UL,_int,_false>._M_head_impl,&local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001bb478;
    bVar1 = MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::MatchAndExplain
                      ((MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> *)matcher_tuple,
                       (value_tuple->
                       super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
                       super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
                       super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>.
                       _M_head_impl,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }